

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

UVec4 __thiscall tcu::getTextureBorderColorUint(tcu *this,TextureFormat *format,Sampler *sampler)

{
  ChannelType channelType;
  uint uVar1;
  uint uVar2;
  TextureSwizzle *pTVar3;
  long lVar4;
  long lVar5;
  UVec4 UVar6;
  UVec4 valueMax;
  IVec4 channelBits;
  uint local_48 [4];
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  channelType = format->type;
  pTVar3 = getBorderColorReadSwizzle(format->order);
  getChannelBitDepth(channelType);
  local_48[0] = -1 << ((byte)local_38 & 0x1f) ^ 0xffffffff;
  if (0x1f < local_38) {
    local_48[0] = 0xffffffff;
  }
  lVar5 = 0;
  uVar2 = 0;
  if (local_38 < 1) {
    local_48[0] = uVar2;
  }
  local_48[1] = -1 << ((byte)local_34 & 0x1f) ^ 0xffffffff;
  if (0x1f < local_34) {
    local_48[1] = 0xffffffff;
  }
  if (local_34 < 1) {
    local_48[1] = uVar2;
  }
  local_48[2] = -1 << ((byte)local_30 & 0x1f) ^ 0xffffffff;
  if (0x1f < local_30) {
    local_48[2] = 0xffffffff;
  }
  if (local_30 < 1) {
    local_48[2] = uVar2;
  }
  local_48[3] = -1 << ((byte)local_2c & 0x1f) ^ 0xffffffff;
  if (0x1f < local_2c) {
    local_48[3] = 0xffffffff;
  }
  if (local_2c < 1) {
    local_48[3] = uVar2;
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  do {
    lVar4 = (long)(int)pTVar3->components[lVar5];
    uVar2 = 0;
    if (lVar4 != 4) {
      if (pTVar3->components[lVar5] == CHANNEL_ONE) {
        uVar2 = 1;
      }
      else {
        uVar1 = (sampler->borderColor).v.uData[lVar4];
        uVar2 = local_48[lVar4];
        if (uVar1 < local_48[lVar4]) {
          uVar2 = uVar1;
        }
      }
    }
    *(uint *)(this + lVar5 * 4) = uVar2;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  UVar6.m_data[2] = 4;
  UVar6.m_data[3] = 0;
  UVar6.m_data._0_8_ = this;
  return (UVec4)UVar6.m_data;
}

Assistant:

static tcu::UVec4 getTextureBorderColorUint (const TextureFormat& format, const Sampler& sampler)
{
	const tcu::TextureChannelClass	channelClass	= getTextureChannelClass(format.type);
	const TextureSwizzle::Channel*	channelMap		= getBorderColorReadSwizzle(format.order).components;
	const IVec4						channelBits		= getChannelBitDepth(format.type);
	const UVec4						valueMax		= getNBitUnsignedIntegerVec4MaxValue(channelBits);
	UVec4							result;

	DE_ASSERT(channelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER);
	DE_UNREF(channelClass);

	for (int c = 0; c < 4; c++)
	{
		const TextureSwizzle::Channel map = channelMap[c];
		if (map == TextureSwizzle::CHANNEL_ZERO)
			result[c] = 0;
		else if (map == TextureSwizzle::CHANNEL_ONE)
			result[c] = 1;
		else
		{
			// integer values are clamped to a representable range
			result[c] = de::min(sampler.borderColor.getAccess<deUint32>()[(int)map], valueMax[(int)map]);
		}
	}

	return result;
}